

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O3

void __thiscall
hedg::params::login::login(login *this,string *username_,string *password_,string *endpoint_)

{
  pointer pcVar1;
  
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  pcVar1 = (username_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + username_->_M_string_length);
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  pcVar1 = (password_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->password,pcVar1,pcVar1 + password_->_M_string_length);
  (this->endpoint)._M_dataplus._M_p = (pointer)&(this->endpoint).field_2;
  pcVar1 = (endpoint_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->endpoint,pcVar1,pcVar1 + endpoint_->_M_string_length);
  return;
}

Assistant:

login::login(std::string username_, std::string password_, std::string endpoint_)
		:username{ username_ }, password{ password_ }, endpoint{ endpoint_ } {}